

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int lookup(hash_table_t *table,hash_key_t key,hash_entry_t **entry)

{
  hash_entry_t *phVar1;
  hash_hashvalue_t hVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int unaff_R13D;
  bool bVar6;
  
  hVar2 = (*table->hashfunc)(key);
  uVar4 = (ulong)(long)hVar2 % table->table_size;
  uVar5 = uVar4;
  do {
    phVar1 = table->table + uVar5;
    if ((table->table[uVar5].status == 2) && (phVar1->hash_value == hVar2)) {
      iVar3 = (*table->keycmp)(phVar1->key,key);
      if (iVar3 != 0) goto LAB_00104fbc;
      *entry = phVar1;
      unaff_R13D = 0;
LAB_00104ff1:
      bVar6 = false;
    }
    else {
LAB_00104fbc:
      if (phVar1->status == 0) {
        unaff_R13D = -1;
        goto LAB_00104ff1;
      }
      uVar5 = uVar5 + 1;
      if (uVar5 == table->table_size) {
        uVar5 = 0;
      }
      bVar6 = uVar5 != uVar4;
      if (!bVar6) {
        unaff_R13D = -1;
      }
    }
    if (!bVar6) {
      return unaff_R13D;
    }
  } while( true );
}

Assistant:

static int lookup(hash_table_t *table, hash_key_t key, hash_entry_t **entry)
{
   size_t index, startindex;
   hash_hashvalue_t hashval;

   hashval = table->hashfunc(key);
   index = hashval % table->table_size;
   startindex = index;
   
   for (;;) {
      hash_entry_t *cur = table->table + index;
      if ((cur->status == INUSE) && 
          (cur->hash_value == hashval) && 
          (table->keycmp(cur->key, key) == 0)) {
         *entry = cur;
         return 0;
      }

      if (cur->status == EMPTY)
         return -1;
      index++;
      if (index == table->table_size)
         index = 0;
      if (index == startindex)
         return -1;
   }
}